

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O1

bool __thiscall DistanceGraph::remove_link(DistanceGraph *this,sgNodeID_t source,sgNodeID_t dest)

{
  pointer pvVar1;
  pointer pLVar2;
  pointer pLVar3;
  pointer pvVar4;
  pointer pLVar5;
  sgNodeID_t sVar6;
  sgNodeID_t sVar7;
  undefined4 uVar8;
  SupportType SVar9;
  undefined1 uVar10;
  uint16_t uVar11;
  undefined4 uVar12;
  long lVar13;
  pointer pLVar14;
  pointer pLVar15;
  pointer pLVar16;
  pointer pLVar17;
  long lVar18;
  bool bVar19;
  
  lVar13 = -source;
  if (0 < source) {
    lVar13 = source;
  }
  pvVar1 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = pvVar1[lVar13].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = *(pointer *)
            ((long)&pvVar1[lVar13].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                    super__Vector_impl_data + 8);
  lVar18 = ((long)pLVar3 - (long)pLVar2 >> 3) * -0x3333333333333333 >> 2;
  pLVar15 = pLVar2;
  if (0 < lVar18) {
    pLVar15 = pLVar2 + lVar18 * 4;
    lVar18 = lVar18 + 1;
    pLVar17 = pLVar2 + 2;
    do {
      if ((pLVar17[-2].source == source) && (pLVar17[-2].dest == dest)) {
        pLVar17 = pLVar17 + -2;
        goto LAB_0017a950;
      }
      if ((pLVar17[-1].source == source) && (pLVar17[-1].dest == dest)) {
        pLVar17 = pLVar17 + -1;
        goto LAB_0017a950;
      }
      if ((pLVar17->source == source) && (pLVar17->dest == dest)) goto LAB_0017a950;
      if ((pLVar17[1].source == source) && (pLVar17[1].dest == dest)) {
        pLVar17 = pLVar17 + 1;
        goto LAB_0017a950;
      }
      lVar18 = lVar18 + -1;
      pLVar17 = pLVar17 + 4;
    } while (1 < lVar18);
  }
  lVar18 = ((long)pLVar3 - (long)pLVar15 >> 3) * -0x3333333333333333;
  if (lVar18 == 1) {
LAB_0017a927:
    pLVar17 = pLVar15;
    if (pLVar15->dest != dest || pLVar15->source != source) {
      pLVar17 = pLVar3;
    }
  }
  else if (lVar18 == 2) {
LAB_0017a918:
    if ((pLVar15->source != source) || (pLVar17 = pLVar15, pLVar15->dest != dest)) {
      pLVar15 = pLVar15 + 1;
      goto LAB_0017a927;
    }
  }
  else {
    pLVar17 = pLVar3;
    if ((lVar18 == 3) && ((pLVar15->source != source || (pLVar17 = pLVar15, pLVar15->dest != dest)))
       ) {
      pLVar15 = pLVar15 + 1;
      goto LAB_0017a918;
    }
  }
LAB_0017a950:
  pvVar1 = pvVar1 + lVar13;
  pLVar15 = pLVar17 + 1;
  if (pLVar15 != pLVar3 && pLVar17 != pLVar3) {
    do {
      if ((pLVar15->source != source) || (pLVar15->dest != dest)) {
        (pLVar17->support).id = (pLVar15->support).id;
        sVar6 = pLVar15->source;
        sVar7 = pLVar15->dest;
        uVar8 = *(undefined4 *)&pLVar15->field_0x14;
        SVar9 = (pLVar15->support).type;
        uVar10 = (pLVar15->support).field_0x1;
        uVar11 = (pLVar15->support).index;
        uVar12 = *(undefined4 *)&(pLVar15->support).field_0x4;
        pLVar17->dist = pLVar15->dist;
        *(undefined4 *)&pLVar17->field_0x14 = uVar8;
        (pLVar17->support).type = SVar9;
        (pLVar17->support).field_0x1 = uVar10;
        (pLVar17->support).index = uVar11;
        *(undefined4 *)&(pLVar17->support).field_0x4 = uVar12;
        pLVar17->source = sVar6;
        pLVar17->dest = sVar7;
        pLVar17 = pLVar17 + 1;
      }
      pLVar15 = pLVar15 + 1;
    } while (pLVar15 != pLVar3);
  }
  pLVar15 = *(pointer *)
             ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                     super__Vector_impl_data + 8);
  if ((pLVar17 != pLVar15) &&
     (pLVar14 = *(pointer *)
                 ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                         super__Vector_impl_data + 8),
     pLVar17 = (pointer)((long)pLVar17 + ((long)pLVar14 - (long)pLVar15)), pLVar14 != pLVar17)) {
    *(pointer *)
     ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
             super__Vector_impl_data + 8) = pLVar17;
  }
  lVar13 = -dest;
  if (0 < dest) {
    lVar13 = dest;
  }
  pvVar4 = (this->links).
           super__Vector_base<std::vector<Link,_std::allocator<Link>_>,_std::allocator<std::vector<Link,_std::allocator<Link>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pLVar15 = pvVar4[lVar13].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar17 = *(pointer *)
             ((long)&pvVar4[lVar13].super__Vector_base<Link,_std::allocator<Link>_>._M_impl.
                     super__Vector_impl_data + 8);
  lVar18 = ((long)pLVar17 - (long)pLVar15 >> 3) * -0x3333333333333333 >> 2;
  pLVar14 = pLVar15;
  if (0 < lVar18) {
    pLVar14 = pLVar15 + lVar18 * 4;
    lVar18 = lVar18 + 1;
    pLVar16 = pLVar15 + 2;
    do {
      if ((pLVar16[-2].source == dest) && (pLVar16[-2].dest == source)) {
        pLVar16 = pLVar16 + -2;
        goto LAB_0017aabd;
      }
      if ((pLVar16[-1].source == dest) && (pLVar16[-1].dest == source)) {
        pLVar16 = pLVar16 + -1;
        goto LAB_0017aabd;
      }
      if ((pLVar16->source == dest) && (pLVar16->dest == source)) goto LAB_0017aabd;
      if ((pLVar16[1].source == dest) && (pLVar16[1].dest == source)) {
        pLVar16 = pLVar16 + 1;
        goto LAB_0017aabd;
      }
      lVar18 = lVar18 + -1;
      pLVar16 = pLVar16 + 4;
    } while (1 < lVar18);
  }
  lVar18 = ((long)pLVar17 - (long)pLVar14 >> 3) * -0x3333333333333333;
  if (lVar18 != 1) {
    if (lVar18 != 2) {
      pLVar16 = pLVar17;
      if ((lVar18 != 3) ||
         ((pLVar14->source == dest && (pLVar16 = pLVar14, pLVar14->dest == source))))
      goto LAB_0017aabd;
      pLVar14 = pLVar14 + 1;
    }
    if ((pLVar14->source == dest) && (pLVar16 = pLVar14, pLVar14->dest == source))
    goto LAB_0017aabd;
    pLVar14 = pLVar14 + 1;
  }
  pLVar16 = pLVar14;
  if (pLVar14->dest != source || pLVar14->source != dest) {
    pLVar16 = pLVar17;
  }
LAB_0017aabd:
  pvVar4 = pvVar4 + lVar13;
  pLVar14 = pLVar16 + 1;
  if (pLVar14 != pLVar17 && pLVar16 != pLVar17) {
    do {
      if ((pLVar14->source != dest) || (pLVar14->dest != source)) {
        (pLVar16->support).id = (pLVar14->support).id;
        sVar6 = pLVar14->source;
        sVar7 = pLVar14->dest;
        uVar8 = *(undefined4 *)&pLVar14->field_0x14;
        SVar9 = (pLVar14->support).type;
        uVar10 = (pLVar14->support).field_0x1;
        uVar11 = (pLVar14->support).index;
        uVar12 = *(undefined4 *)&(pLVar14->support).field_0x4;
        pLVar16->dist = pLVar14->dist;
        *(undefined4 *)&pLVar16->field_0x14 = uVar8;
        (pLVar16->support).type = SVar9;
        (pLVar16->support).field_0x1 = uVar10;
        (pLVar16->support).index = uVar11;
        *(undefined4 *)&(pLVar16->support).field_0x4 = uVar12;
        pLVar16->source = sVar6;
        pLVar16->dest = sVar7;
        pLVar16 = pLVar16 + 1;
      }
      pLVar14 = pLVar14 + 1;
    } while (pLVar14 != pLVar17);
  }
  pLVar14 = *(pointer *)
             ((long)&(pvVar4->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                     super__Vector_impl_data + 8);
  if ((pLVar16 != pLVar14) &&
     (pLVar5 = *(pointer *)
                ((long)&(pvVar4->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                        super__Vector_impl_data + 8),
     pLVar16 = (pointer)((long)pLVar16 + ((long)pLVar5 - (long)pLVar14)), pLVar5 != pLVar16)) {
    *(pointer *)
     ((long)&(pvVar4->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
             super__Vector_impl_data + 8) = pLVar16;
  }
  bVar19 = true;
  if ((long)*(pointer *)
             ((long)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                     super__Vector_impl_data + 8) -
      *(long *)&(pvVar1->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                super__Vector_impl_data == (long)pLVar3 - (long)pLVar2) {
    bVar19 = (long)*(pointer *)
                    ((long)&(pvVar4->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&(pvVar4->super__Vector_base<Link,_std::allocator<Link>_>)._M_impl.
                       super__Vector_impl_data != (long)pLVar17 - (long)pLVar15;
  }
  return bVar19;
}

Assistant:

bool DistanceGraph::remove_link(sgNodeID_t source, sgNodeID_t dest) {
    auto & slinks = links[(source > 0 ? source : -source)];
    auto slinksLen = slinks.size();
    slinks.erase(std::remove_if(slinks.begin(), slinks.end(), [source,dest] (auto l) {return l.source==source and l.dest==dest;}), slinks.end());
    auto & dlinks = links[(dest > 0 ? dest : -dest)];
    auto dlinksLen = dlinks.size();
    dlinks.erase(std::remove_if(dlinks.begin(), dlinks.end(), [source,dest] (auto l) {return l.source==dest and l.dest==source;}), dlinks.end());
    if (slinks.size() != slinksLen or dlinks.size() != dlinksLen) return true;
    return false;
}